

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O3

int __thiscall
zmq::socket_base_t::getsockopt
          (socket_base_t *this,int __fd,int __level,int __optname,void *__optval,socklen_t *__optlen
          )

{
  int __errnum;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  char *errmsg_;
  undefined4 in_register_0000000c;
  size_t *optvallen_;
  undefined4 in_register_00000014;
  void *optval_;
  mutex_t *mutex_;
  scoped_optional_lock_t sync_lock;
  uint local_3c;
  scoped_optional_lock_t local_38;
  
  optval_ = (void *)CONCAT44(in_register_00000014,__level);
  optvallen_ = (size_t *)CONCAT44(in_register_0000000c,__optname);
  mutex_ = (mutex_t *)0x0;
  if (this->_thread_safe != false) {
    mutex_ = &this->_sync;
  }
  scoped_optional_lock_t::scoped_optional_lock_t(&local_38,mutex_);
  if (this->_ctx_terminated == true) {
    piVar4 = __errno_location();
    *piVar4 = 0x9523dfd;
LAB_001db572:
    iVar1 = -1;
  }
  else {
    if (__fd < 0xf) {
      if (__fd == 0xd) {
        local_3c = (uint)this->_rcvmore;
        iVar1 = do_getsockopt(optval_,optvallen_,&local_3c,4);
        goto LAB_001db640;
      }
      if (__fd == 0xe) {
        if (this->_thread_safe != true) {
          local_3c = mailbox_t::get_fd((mailbox_t *)this->_mailbox);
          iVar1 = do_getsockopt(optval_,optvallen_,&local_3c,4);
          goto LAB_001db640;
        }
        piVar4 = __errno_location();
        *piVar4 = 0x16;
        goto LAB_001db572;
      }
    }
    else {
      if (__fd == 0xf) {
        iVar1 = process_commands(this,0,false);
        if (iVar1 != 0) {
          piVar4 = __errno_location();
          __errnum = *piVar4;
          iVar1 = -1;
          if ((__errnum == 4) || (__errnum == 0x9523dfd)) goto LAB_001db640;
          errmsg_ = strerror(__errnum);
          fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
                  ,0x1e4);
          fflush(_stderr);
          zmq_abort(errmsg_);
        }
        uVar2 = (*(this->super_own_t).super_object_t._vptr_object_t[0x22])(this);
        uVar3 = (*(this->super_own_t).super_object_t._vptr_object_t[0x24])(this);
        local_3c = (uVar3 & 0xff) + (uVar2 & 0xff) * 2;
        iVar1 = do_getsockopt(optval_,optvallen_,&local_3c,4);
        goto LAB_001db640;
      }
      if (__fd == 0x20) {
        iVar1 = do_getsockopt(optval_,optvallen_,&this->_last_endpoint);
        goto LAB_001db640;
      }
      if (__fd == 0x51) {
        local_3c = (uint)this->_thread_safe;
        iVar1 = do_getsockopt(optval_,optvallen_,&local_3c,4);
        goto LAB_001db640;
      }
    }
    iVar1 = options_t::getsockopt
                      (&(this->super_own_t).options,__fd,__level,__optname,__optval,__optlen);
  }
LAB_001db640:
  scoped_optional_lock_t::~scoped_optional_lock_t(&local_38);
  return iVar1;
}

Assistant:

int zmq::socket_base_t::getsockopt (int option_,
                                    void *optval_,
                                    size_t *optvallen_)
{
    scoped_optional_lock_t sync_lock (_thread_safe ? &_sync : NULL);

    if (unlikely (_ctx_terminated)) {
        errno = ETERM;
        return -1;
    }

    if (option_ == ZMQ_RCVMORE) {
        return do_getsockopt<int> (optval_, optvallen_, _rcvmore ? 1 : 0);
    }

    if (option_ == ZMQ_FD) {
        if (_thread_safe) {
            // thread safe socket doesn't provide file descriptor
            errno = EINVAL;
            return -1;
        }

        return do_getsockopt<fd_t> (
          optval_, optvallen_,
          (static_cast<mailbox_t *> (_mailbox))->get_fd ());
    }

    if (option_ == ZMQ_EVENTS) {
        const int rc = process_commands (0, false);
        if (rc != 0 && (errno == EINTR || errno == ETERM)) {
            return -1;
        }
        errno_assert (rc == 0);

        return do_getsockopt<int> (optval_, optvallen_,
                                   (has_out () ? ZMQ_POLLOUT : 0)
                                     | (has_in () ? ZMQ_POLLIN : 0));
    }

    if (option_ == ZMQ_LAST_ENDPOINT) {
        return do_getsockopt (optval_, optvallen_, _last_endpoint);
    }

    if (option_ == ZMQ_THREAD_SAFE) {
        return do_getsockopt<int> (optval_, optvallen_, _thread_safe ? 1 : 0);
    }

    return options.getsockopt (option_, optval_, optvallen_);
}